

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void initLayoutStruct(QLayoutStruct *sl,QFormLayoutItem *item)

{
  uint uVar1;
  int iVar2;
  Int IVar3;
  QFormLayoutItem *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  Orientation in_stack_ffffffffffffffcc;
  QFormLayoutItem *this;
  QFlagsStorageHelper<Qt::Orientation,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  uVar1 = QFormLayoutItem::vStretch(in_RDI);
  QSize::height((QSize *)0x4b4a02);
  QLayoutStruct::init((QLayoutStruct *)this,(EVP_PKEY_CTX *)(ulong)uVar1);
  iVar2 = QSize::height((QSize *)0x4b4a20);
  *(int *)((long)&in_RDI->item + 4) = iVar2;
  iVar2 = QSize::height((QSize *)0x4b4a38);
  in_RDI->fullRow = (bool)(char)iVar2;
  in_RDI->isVisible = (bool)(char)((uint)iVar2 >> 8);
  in_RDI->isHfw = (bool)(char)((uint)iVar2 >> 0x10);
  in_RDI->field_0xb = (char)((uint)iVar2 >> 0x18);
  QFormLayoutItem::expandingDirections
            ((QFormLayoutItem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  local_c.super_QFlagsStorage<Qt::Orientation>.i =
       (QFlagsStorage<Qt::Orientation>)
       QFlags<Qt::Orientation>::operator&((QFlags<Qt::Orientation> *)this,in_stack_ffffffffffffffcc)
  ;
  IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  *(bool *)&(in_RDI->sizeHint).wd.m_i = IVar3 != 0;
  *(undefined1 *)((long)&(in_RDI->sizeHint).wd.m_i + 1) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void initLayoutStruct(QLayoutStruct& sl, QFormLayoutItem* item)
{
    sl.init(item->vStretch(), item->minSize.height());
    sl.sizeHint = item->sizeHint.height();
    sl.maximumSize = item->maxSize.height();
    sl.expansive = (item->expandingDirections() & Qt::Vertical);
    sl.empty = false;
}